

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O2

int Nwk_ManPushForwardTop_rec(Nwk_Obj_t *pObj,Nwk_Obj_t *pPred)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar1 = Nwk_ObjVisitedTop(pObj);
  iVar2 = 0;
  if (iVar1 == 0) {
    Nwk_ObjSetVisitedTop(pObj);
    if ((pObj->field_0x20 & 0x10) == 0) {
      lVar3 = 0;
      do {
        if ((pObj->nFanouts <= (int)lVar3) ||
           (pObj->pFanio[pObj->nFanins + lVar3] == (Nwk_Obj_t *)0x0)) {
          if ((*(uint *)&pObj->field_0x20 & 7) == 1 || (*(uint *)&pObj->field_0x20 & 0x20) == 0) {
            return 0;
          }
          iVar1 = Nwk_ManPushForwardBot_rec(pObj,(Nwk_Obj_t *)pObj->pCopy);
          if (iVar1 == 0) {
            return 0;
          }
          pObj->field_0x20 = pObj->field_0x20 & 0xdf;
          pObj->pCopy = (void *)0x0;
          break;
        }
        iVar1 = Nwk_ManPushForwardBot_rec(pObj->pFanio[pObj->nFanins + lVar3],pPred);
        lVar3 = lVar3 + 1;
      } while (iVar1 == 0);
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int Nwk_ManPushForwardTop_rec( Nwk_Obj_t * pObj, Nwk_Obj_t * pPred )
{
    Nwk_Obj_t * pNext;
    int i;
    if ( Nwk_ObjVisitedTop(pObj) )
        return 0;
    Nwk_ObjSetVisitedTop(pObj);
    // check if this is the sink
    if ( Nwk_ObjIsSink(pObj) )
        return 1;
    // try to push through the fanouts
    Nwk_ObjForEachFanout( pObj, pNext, i )
        if ( Nwk_ManPushForwardBot_rec( pNext, pPred ) )
            return 1;
    // redirect the flow
    if ( Nwk_ObjHasFlow(pObj) && !Nwk_ObjIsCi(pObj) )
        if ( Nwk_ManPushForwardBot_rec( pObj, Nwk_ObjPred(pObj) ) )
        {
            Nwk_ObjClearFlow( pObj );
            return Nwk_ObjSetPred( pObj, NULL );
        }
    return 0;
}